

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::option_not_has_argument_exception::~option_not_has_argument_exception
          (option_not_has_argument_exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__OptionException_001445c0;
  pcVar1 = (this->super_OptionParseException).super_OptionException.m_message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_OptionParseException).super_OptionException.m_message.field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this);
  return;
}

Assistant:

option_not_has_argument_exception
    (
      const std::string& option,
      const std::string& arg
    )
    : OptionParseException(
        u8"Option ‘" + option + u8"’ does not take an argument, but argument‘"
        + arg + "’ given")
    {
    }